

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  GetterXsYs<int> *pGVar6;
  TransformerLogLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  ushort uVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar32;
  float fVar33;
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar45 [16];
  
  pIVar16 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar18 = pGVar6->Count;
  lVar19 = (long)(((pGVar6->Offset + prim + 1) % iVar18 + iVar18) % iVar18) * (long)pGVar6->Stride;
  iVar18 = *(int *)((long)pGVar6->Ys + lVar19);
  dVar11 = log10((double)*(int *)((long)pGVar6->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar8->XAxis).Range.Min;
  dVar3 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10((double)iVar18 / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar7->YAxis;
  pIVar8 = pIVar16->CurrentPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar6->Count;
  lVar19 = (long)(((prim + 1 + pGVar6->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride;
  auVar37._8_8_ = dVar12;
  auVar37._0_8_ = dVar11;
  iVar5 = *(int *)((long)pGVar6->Ys + lVar19);
  auVar13._8_4_ = SUB84(pIVar16->LogDenY[iVar18],0);
  auVar13._0_8_ = dVar1;
  auVar13._12_4_ = (int)((ulong)pIVar16->LogDenY[iVar18] >> 0x20);
  auVar38 = divpd(auVar37,auVar13);
  dVar1 = pIVar8->YAxis[iVar18].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar27 = (float)(pIVar16->Mx *
                   (((double)(float)auVar38._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar4.x);
  fVar29 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar38._8_8_ * (pIVar8->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar11 = log10((double)*(int *)((long)pGVar6->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar17->CurrentPlot;
  dVar1 = pIVar17->LogDenX;
  dVar2 = (pIVar8->XAxis).Range.Min;
  dVar3 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10((double)iVar5 / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  iVar18 = pTVar7->YAxis;
  auVar31._8_8_ = dVar12;
  auVar31._0_8_ = dVar11;
  auVar38._8_4_ = SUB84(pIVar17->LogDenY[iVar18],0);
  auVar38._0_8_ = dVar1;
  auVar38._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar18] >> 0x20);
  auVar38 = divpd(auVar31,auVar38);
  pIVar8 = pIVar17->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar28 = (float)(pIVar17->Mx *
                   (((double)(float)auVar38._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar4.x);
  fVar30 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar38._8_8_ * (pIVar8->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar14 = (this->P12).x;
  fVar32 = (this->P12).y;
  fVar34 = (this->P11).x;
  fVar35 = (this->P11).y;
  uVar25 = -(uint)(fVar35 < fVar32);
  fVar33 = (float)(~-(uint)(fVar14 <= fVar34) & (uint)fVar14 |
                  (uint)fVar34 & -(uint)(fVar14 <= fVar34));
  fVar36 = (float)(~-(uint)(fVar32 <= fVar35) & (uint)fVar32 |
                  (uint)fVar35 & -(uint)(fVar32 <= fVar35));
  fVar40 = (float)(~-(uint)(fVar34 < fVar14) & (uint)fVar14 |
                  (uint)fVar34 & -(uint)(fVar34 < fVar14));
  fVar49 = (float)(~uVar25 & (uint)fVar32 | (uint)fVar35 & uVar25);
  uVar22 = -(uint)(fVar27 <= fVar33);
  uVar23 = -(uint)(fVar29 <= fVar36);
  uVar24 = -(uint)(fVar40 < fVar27);
  uVar26 = -(uint)(fVar49 < fVar29);
  fVar33 = (float)(~uVar22 & (uint)fVar27 | (uint)fVar33 & uVar22);
  fVar36 = (float)(~uVar23 & (uint)fVar29 | (uint)fVar36 & uVar23);
  fVar40 = (float)(~uVar24 & (uint)fVar27 | (uint)fVar40 & uVar24);
  fVar49 = (float)(~uVar26 & (uint)fVar29 | (uint)fVar49 & uVar26);
  uVar22 = -(uint)(fVar28 <= fVar33);
  uVar23 = -(uint)(fVar30 <= fVar36);
  uVar24 = -(uint)(fVar40 < fVar28);
  uVar26 = -(uint)(fVar49 < fVar30);
  auVar41._0_4_ = (uint)fVar33 & uVar22;
  auVar41._4_4_ = (uint)fVar36 & uVar23;
  auVar41._8_4_ = (uint)fVar40 & uVar24;
  auVar41._12_4_ = (uint)fVar49 & uVar26;
  auVar46._0_4_ = ~uVar22 & (uint)fVar28;
  auVar46._4_4_ = ~uVar23 & (uint)fVar30;
  auVar46._8_4_ = ~uVar24 & (uint)fVar28;
  auVar46._12_4_ = ~uVar26 & (uint)fVar30;
  auVar46 = auVar46 | auVar41;
  fVar33 = (cull_rect->Min).y;
  auVar48._4_4_ = -(uint)(fVar33 < auVar46._4_4_);
  auVar48._0_4_ = -(uint)((cull_rect->Min).x < auVar46._0_4_);
  auVar15._4_8_ = auVar46._8_8_;
  auVar15._0_4_ = -(uint)(auVar46._4_4_ < fVar33);
  auVar47._0_8_ = auVar15._0_8_ << 0x20;
  auVar47._8_4_ = -(uint)(auVar46._8_4_ < (cull_rect->Max).x);
  auVar47._12_4_ = -(uint)(auVar46._12_4_ < (cull_rect->Max).y);
  auVar48._8_8_ = auVar47._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar48);
  if (iVar18 == 0xf) {
    fVar36 = fVar29 * fVar34 - fVar35 * fVar27;
    fVar40 = fVar30 * fVar14 - fVar32 * fVar28;
    fVar33 = fVar32 - fVar30;
    auVar42._4_4_ = fVar33;
    auVar42._0_4_ = fVar33;
    auVar42._8_4_ = fVar33;
    auVar42._12_4_ = fVar33;
    auVar43._4_12_ = auVar42._4_12_;
    auVar43._0_4_ = fVar33 * (fVar34 - fVar27) - (fVar35 - fVar29) * (fVar14 - fVar28);
    auVar39._0_4_ = fVar36 * (fVar14 - fVar28) - fVar40 * (fVar34 - fVar27);
    auVar39._4_4_ = fVar36 * fVar33 - fVar40 * (fVar35 - fVar29);
    auVar39._8_4_ = fVar29 * 0.0 - fVar30 * 0.0;
    auVar39._12_4_ = fVar29 * 0.0 - fVar30 * 0.0;
    auVar45._0_8_ = auVar43._0_8_;
    auVar45._8_4_ = fVar33;
    auVar45._12_4_ = fVar33;
    auVar44._8_8_ = auVar45._8_8_;
    auVar44._4_4_ = auVar43._0_4_;
    auVar44._0_4_ = auVar43._0_4_;
    auVar38 = divps(auVar39,auVar44);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = this->Col;
    pIVar9[1].pos.x = fVar27;
    pIVar9[1].pos.y = fVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = this->Col;
    pIVar9[2].pos = auVar38._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = this->Col;
    pIVar9[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = this->Col;
    IVar4.y = fVar30;
    IVar4.x = fVar28;
    pIVar9[4].pos = IVar4;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar9 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar10 = IVar21;
    uVar20 = (byte)((byte)uVar25 & fVar30 < fVar29 | -(fVar32 < fVar35) & -(fVar29 < fVar30)) & 1;
    pIVar10[1] = IVar21 + uVar20 + 1;
    pIVar10[2] = IVar21 + 3;
    pIVar10[3] = IVar21 + 1;
    pIVar10[4] = (uVar20 ^ 3) + IVar21;
    pIVar10[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  (this->P11).x = fVar27;
  (this->P11).y = fVar29;
  (this->P12).x = fVar28;
  (this->P12).y = fVar30;
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }